

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPoint2PointConstraint.cpp
# Opt level: O1

void __thiscall
btPoint2PointConstraint::getInfo1NonVirtual(btPoint2PointConstraint *this,btConstraintInfo1 *info)

{
  int iVar1;
  
  iVar1 = (this->m_useSolveConstraintObsolete ^ 1) * 3;
  info->m_numConstraintRows = iVar1;
  info->nub = iVar1;
  return;
}

Assistant:

void btPoint2PointConstraint::getInfo1NonVirtual (btConstraintInfo1* info)
{
	if (m_useSolveConstraintObsolete)
	{
		info->m_numConstraintRows = 0;
		info->nub = 0;
	} else
	{
		info->m_numConstraintRows = 3;
		info->nub = 3;
	}
}